

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O0

string * EscapeArg(string *__return_storage_ptr__,string *arg)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char i;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *arg_local;
  string *escapedArg;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (cVar1 == ';') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string EscapeArg(const std::string& arg)
{
  // replace ";" with "\;" so output argument lists will split correctly
  std::string escapedArg;
  for (char i : arg) {
    if (i == ';') {
      escapedArg += '\\';
    }
    escapedArg += i;
  }
  return escapedArg;
}